

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::buffer_expchar(CVmFormatter *this,wchar_t c)

{
  char *pcVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  size_t __n;
  vmcon_color_t *pvVar6;
  wchar_t in_ESI;
  CVmFormatter *in_RDI;
  int nxti;
  size_t tmpchars;
  uchar tmpflags [2048];
  vmcon_color_t tmpcolor [2048];
  wchar_t tmpbuf [2048];
  uchar prvf;
  uchar f;
  int i;
  int shy;
  wchar_t prv;
  wchar_t *l;
  wchar_t *u;
  int qspace;
  uchar cflags;
  int cwid;
  undefined4 in_stack_ffffffffffff1788;
  uint in_stack_ffffffffffff178c;
  uint padding;
  uint in_stack_ffffffffffff1790;
  wchar_t in_stack_ffffffffffff1794;
  wchar_t *local_e868;
  bool local_e85d;
  int local_e844;
  undefined1 local_e838 [2048];
  undefined1 local_e038 [49152];
  undefined1 local_2038 [8194];
  undefined1 local_36;
  byte local_35;
  int local_34;
  int local_30;
  wchar_t local_2c;
  wchar_t *local_28;
  wchar_t *local_20;
  uint local_18;
  byte local_11;
  int local_10;
  wchar_t local_c;
  
  local_10 = 1;
  local_11 = in_RDI->cur_flags_;
  local_18 = 0;
  local_c = in_ESI;
  if ((*(ushort *)&in_RDI->field_0xef81 >> 6 & 1) == 0) {
    if (in_ESI == L'\x15') {
LAB_002cdc49:
      local_18 = 1;
      local_c = L' ';
    }
    else {
      if (in_ESI == L'\xa0') goto LAB_002cdd0e;
      if (in_ESI == L'­') {
        if (in_RDI->linepos_ == 0) {
          return;
        }
        iVar4 = in_RDI->linepos_ + -1;
        in_RDI->flagbuf_[iVar4] = in_RDI->flagbuf_[iVar4] | 8;
        return;
      }
      if (in_ESI != L'\x2002') {
        if (in_ESI == L'\x2003') {
          local_18 = 1;
          local_10 = 3;
          local_c = L' ';
          goto LAB_002cdd0e;
        }
        if (in_ESI != L'\x2004') {
          if (2 < (uint)(in_ESI + L'\xffffdffb')) {
            if (in_ESI == L'\x2008') {
LAB_002cdbf9:
              if (in_RDI->linepos_ == 0) {
                return;
              }
              iVar4 = in_RDI->linepos_ + -1;
              in_RDI->flagbuf_[iVar4] = in_RDI->flagbuf_[iVar4] & 0xfe;
              iVar4 = in_RDI->linepos_ + -1;
              in_RDI->flagbuf_[iVar4] = in_RDI->flagbuf_[iVar4] | 2;
              return;
            }
            if (in_ESI != L'\x2009') {
              if (1 < (uint)(in_ESI + L'\xffffdff6')) {
                if (in_ESI == L'\xfeff') {
                  if (in_RDI->linepos_ == 0) {
                    return;
                  }
                  iVar4 = in_RDI->linepos_ + -1;
                  in_RDI->flagbuf_[iVar4] = in_RDI->flagbuf_[iVar4] | 1;
                  return;
                }
                iVar4 = t3_is_space(L'\0');
                if (iVar4 != 0) {
                  local_c = L' ';
                  local_e85d = true;
                  if ((*(ushort *)&in_RDI->field_0xef81 & 1) == 0) {
                    local_e85d = 0 < in_RDI->html_pre_level_;
                  }
                  local_18 = (uint)local_e85d;
                }
                goto LAB_002cdd0e;
              }
              goto LAB_002cdbf9;
            }
          }
          goto LAB_002cdc49;
        }
      }
      local_18 = 1;
      local_10 = 2;
      local_c = L' ';
    }
    goto LAB_002cdd0e;
  }
  cVar3 = (char)in_ESI;
  switch(in_RDI->html_passthru_state_) {
  case VMCON_HPS_NORMAL:
  case VMCON_HPS_MARKUP_END:
    if (in_ESI == L'&') {
      in_RDI->html_passthru_state_ = VMCON_HPS_ENTITY_1ST;
    }
    else if (in_ESI == L'<') {
      in_RDI->html_passthru_tagp_ = in_RDI->html_passthru_tag_;
      in_RDI->html_passthru_state_ = VMCON_HPS_TAG_START;
    }
    else {
      in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
    }
    break;
  case VMCON_HPS_TAG_START:
    if ((in_ESI == L'/') && (in_RDI->html_passthru_tagp_ == in_RDI->html_passthru_tag_)) {
      pcVar1 = in_RDI->html_passthru_tagp_;
      in_RDI->html_passthru_tagp_ = pcVar1 + 1;
      *pcVar1 = '/';
    }
    else if (((in_ESI < L'a') || (L'z' < in_ESI)) && ((in_ESI < L'A' || (L'Z' < in_ESI)))) {
      if ((((in_ESI != L' ') && (in_ESI != L'\t')) && (in_ESI != L'\n')) && (in_ESI != L'\r')) {
        in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
      }
    }
    else {
      in_RDI->html_passthru_state_ = VMCON_HPS_TAG_NAME;
      pcVar1 = in_RDI->html_passthru_tagp_;
      in_RDI->html_passthru_tagp_ = pcVar1 + 1;
      *pcVar1 = cVar3;
    }
    break;
  case VMCON_HPS_TAG_NAME:
    if (((L'`' < in_ESI) && (in_ESI < L'{')) || ((L'@' < in_ESI && (in_ESI < L'[')))) {
      if ((long)(in_RDI->html_passthru_tagp_ + (1 - (long)in_RDI->html_passthru_tag_)) < 0x20) {
        pcVar1 = in_RDI->html_passthru_tagp_;
        in_RDI->html_passthru_tagp_ = pcVar1 + 1;
        *pcVar1 = cVar3;
      }
      break;
    }
    *in_RDI->html_passthru_tagp_ = '\0';
    in_RDI->html_passthru_state_ = VMCON_HPS_TAG;
    goto LAB_002cd946;
  case VMCON_HPS_TAG:
LAB_002cd946:
    if (in_ESI == L'>') {
      in_RDI->html_passthru_state_ = VMCON_HPS_MARKUP_END;
      iVar4 = stricmp((char *)CONCAT44(in_stack_ffffffffffff1794,in_stack_ffffffffffff1790),
                      (char *)CONCAT44(in_stack_ffffffffffff178c,in_stack_ffffffffffff1788));
      if (iVar4 == 0) {
        in_RDI->html_pre_level_ = in_RDI->html_pre_level_ + 1;
      }
      else {
        iVar4 = stricmp((char *)CONCAT44(in_stack_ffffffffffff1794,in_stack_ffffffffffff1790),
                        (char *)CONCAT44(in_stack_ffffffffffff178c,in_stack_ffffffffffff1788));
        if ((iVar4 == 0) && (in_RDI->html_pre_level_ != 0)) {
          in_RDI->html_pre_level_ = in_RDI->html_pre_level_ + -1;
        }
      }
    }
    else if (((in_ESI == L'/') && (in_RDI->html_passthru_tagp_ != in_RDI->html_passthru_tag_)) &&
            (in_RDI->html_passthru_tagp_[-1] != '/')) {
      if ((long)(in_RDI->html_passthru_tagp_ + (1 - (long)in_RDI->html_passthru_tag_)) < 0x20) {
        pcVar1 = in_RDI->html_passthru_tagp_;
        in_RDI->html_passthru_tagp_ = pcVar1 + 1;
        *pcVar1 = cVar3;
        *in_RDI->html_passthru_tagp_ = '\0';
      }
    }
    else if (in_ESI == L'\"') {
      in_RDI->html_passthru_state_ = VMCON_HPS_DQUOTE;
    }
    else if (in_ESI == L'\'') {
      in_RDI->html_passthru_state_ = VMCON_HPS_SQUOTE;
    }
    break;
  default:
    break;
  case VMCON_HPS_SQUOTE:
    if (in_ESI == L'\'') {
      in_RDI->html_passthru_state_ = VMCON_HPS_TAG;
    }
    break;
  case VMCON_HPS_DQUOTE:
    if (in_ESI == L'\"') {
      in_RDI->html_passthru_state_ = VMCON_HPS_TAG;
    }
    break;
  case VMCON_HPS_ENTITY_1ST:
    if (in_ESI == L'#') {
      in_RDI->html_passthru_state_ = VMCON_HPS_ENTITY_NUM_1ST;
    }
    else if (((in_ESI < L'a') || (L'z' < in_ESI)) && ((in_ESI < L'A' || (L'Z' < in_ESI)))) {
      in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
    }
    else {
      in_RDI->html_passthru_state_ = VMCON_HPS_ENTITY_NAME;
    }
    break;
  case VMCON_HPS_ENTITY_NUM_1ST:
    if ((in_ESI == L'x') || (in_ESI == L'X')) {
      in_RDI->html_passthru_state_ = VMCON_HPS_ENTITY_HEX;
    }
    else if ((in_ESI < L'0') || (L'9' < in_ESI)) {
      in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
    }
    else {
      in_RDI->html_passthru_state_ = VMCON_HPS_ENTITY_DEC;
    }
    break;
  case VMCON_HPS_ENTITY_HEX:
    if (in_ESI == L';') {
      in_RDI->html_passthru_state_ = VMCON_HPS_MARKUP_END;
    }
    else if ((((in_ESI < L'0') || (L'9' < in_ESI)) && ((in_ESI < L'a' || (L'f' < in_ESI)))) &&
            ((in_ESI < L'A' || (L'F' < in_ESI)))) {
      in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
    }
    break;
  case VMCON_HPS_ENTITY_DEC:
    if (in_ESI == L';') {
      in_RDI->html_passthru_state_ = VMCON_HPS_MARKUP_END;
    }
    else if ((in_ESI < L'0') || (L'9' < in_ESI)) {
      in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
    }
    break;
  case VMCON_HPS_ENTITY_NAME:
    if (in_ESI == L';') {
      in_RDI->html_passthru_state_ = VMCON_HPS_MARKUP_END;
    }
    else if ((((in_ESI < L'a') || (L'z' < in_ESI)) && ((in_ESI < L'A' || (L'Z' < in_ESI)))) &&
            ((in_ESI < L'0' || (L'9' < in_ESI)))) {
      in_RDI->html_passthru_state_ = VMCON_HPS_NORMAL;
    }
  }
LAB_002cdd0e:
  if (local_18 != 0) {
    local_11 = local_11 | 0x10;
  }
  if (in_RDI->html_passthru_state_ == VMCON_HPS_NORMAL) {
    if ((((*(ushort *)&in_RDI->field_0xef81 >> 2 & 1) == 0) &&
        ((*(ushort *)&in_RDI->field_0xef81 >> 4 & 1) == 0)) ||
       (iVar4 = t3_is_alpha(in_stack_ffffffffffff1794), iVar4 == 0)) {
      if (((*(ushort *)&in_RDI->field_0xef81 >> 3 & 1) != 0) &&
         (iVar4 = t3_is_alpha(in_stack_ffffffffffff1794), iVar4 != 0)) {
        *(ushort *)&in_RDI->field_0xef81 = *(ushort *)&in_RDI->field_0xef81 & 0xfff7;
        local_28 = t3_to_lower(local_c);
        if ((local_28 != (wchar_t *)0x0) && (*local_28 != L'\0')) {
          if (local_28[1] != L'\0') {
            buffer_wstring((CVmFormatter *)
                           CONCAT44(in_stack_ffffffffffff1794,in_stack_ffffffffffff1790),
                           (wchar_t *)CONCAT44(in_stack_ffffffffffff178c,in_stack_ffffffffffff1788))
            ;
            return;
          }
          local_c = *local_28;
        }
      }
    }
    else {
      *(ushort *)&in_RDI->field_0xef81 = *(ushort *)&in_RDI->field_0xef81 & 0xfffb;
      if ((*(ushort *)&in_RDI->field_0xef81 >> 4 & 1) == 0) {
        local_e868 = t3_to_title(local_c);
      }
      else {
        local_e868 = t3_to_upper(local_c);
      }
      local_20 = local_e868;
      if ((local_e868 != (wchar_t *)0x0) && (*local_e868 != L'\0')) {
        if (local_e868[1] != L'\0') {
          buffer_wstring((CVmFormatter *)
                         CONCAT44(in_stack_ffffffffffff1794,in_stack_ffffffffffff1790),
                         (wchar_t *)CONCAT44(in_stack_ffffffffffff178c,in_stack_ffffffffffff1788));
          return;
        }
        local_c = *local_e868;
      }
    }
  }
  if ((local_c == L' ') && (in_RDI->html_pre_level_ == 0)) {
    if ((in_RDI->linecol_ == 0) && (local_18 == 0)) {
      return;
    }
    if (0 < in_RDI->linepos_) {
      local_2c = in_RDI->linebuf_[in_RDI->linepos_ + -1];
      if ((local_18 == 0) && (local_2c == L' ')) {
        return;
      }
      if (((local_18 != 0) && (local_2c == L' ')) &&
         ((in_RDI->flagbuf_[in_RDI->linepos_ + -1] & 0x10) == 0)) {
        in_RDI->linepos_ = in_RDI->linepos_ + -1;
        in_RDI->linecol_ = in_RDI->linecol_ + -1;
      }
    }
  }
  iVar4 = in_RDI->linecol_ + local_10;
  iVar5 = (*in_RDI->_vptr_CVmFormatter[0xe])();
  if (iVar4 < iVar5) {
    buffer_rendered(in_RDI,local_c,local_11,local_10);
  }
  else if (local_c == L' ') {
    if (in_RDI->linebuf_[in_RDI->linepos_ + -1] != L' ') {
      in_RDI->linebuf_[in_RDI->linepos_] = L' ';
      in_RDI->flagbuf_[in_RDI->linepos_] = local_11;
      pvVar6 = in_RDI->colorbuf_ + in_RDI->linepos_;
      pvVar6->fg = (in_RDI->cur_color_).fg;
      pvVar6->bg = (in_RDI->cur_color_).bg;
      uVar2 = *(undefined4 *)&(in_RDI->cur_color_).field_0x14;
      pvVar6->attr = (in_RDI->cur_color_).attr;
      *(undefined4 *)&pvVar6->field_0x14 = uVar2;
      in_RDI->linepos_ = in_RDI->linepos_ + 1;
    }
    in_RDI->linecol_ = local_10 + in_RDI->linecol_;
  }
  else {
    in_RDI->linebuf_[in_RDI->linepos_] = local_c;
    in_RDI->flagbuf_[in_RDI->linepos_] = in_RDI->cur_flags_;
    if ((*(ushort *)&in_RDI->field_0xef81 >> 8 & 1) == 0) {
      local_34 = in_RDI->linepos_;
      local_30 = 0;
      for (; -1 < local_34; local_34 = local_34 + -1) {
        local_35 = in_RDI->flagbuf_[local_34];
        if (local_34 < 1) {
          in_stack_ffffffffffff1790 = 0;
        }
        else {
          in_stack_ffffffffffff1790 = (uint)in_RDI->flagbuf_[local_34 + -1];
        }
        local_36 = (undefined1)in_stack_ffffffffffff1790;
        if ((in_stack_ffffffffffff1790 & 1) == 0) {
          if ((((in_stack_ffffffffffff1790 & 2) != 0) || ((local_35 & 4) != 0)) ||
             ((0 < local_34 && ((in_stack_ffffffffffff1790 & 4) != 0)))) break;
          if (((0 < local_34) && (local_34 < in_RDI->linepos_)) &&
             ((in_stack_ffffffffffff1790 & 8) != 0)) {
            local_30 = 1;
            break;
          }
          if (((in_RDI->linebuf_[local_34] == L' ') ||
              ((0 < local_34 && (in_RDI->linebuf_[local_34 + -1] == L' ')))) ||
             ((0 < local_34 &&
              ((in_RDI->linebuf_[local_34 + -1] == L'-' && (in_RDI->linebuf_[local_34] != L'-'))))))
          break;
        }
      }
      if (local_34 < 0) {
        iVar5 = (*in_RDI->console_->_vptr_CVmConsole[7])();
        if ((iVar5 == 0) || (0x7ff < in_RDI->linepos_ + 1)) {
          flush_line((CVmFormatter *)CONCAT44(iVar4,in_stack_ffffffffffff1790),
                     in_stack_ffffffffffff178c);
          in_RDI->linepos_ = 0;
          in_RDI->linecol_ = 0;
          in_RDI->linebuf_[0] = L'\0';
          in_RDI->is_continuation_ = 0;
        }
      }
      else {
        in_RDI->linebuf_[in_RDI->linepos_] = L'\0';
        for (local_e844 = local_34; in_RDI->linebuf_[local_e844] == L' ';
            local_e844 = local_e844 + 1) {
        }
        __n = wcslen(in_RDI->linebuf_ + local_e844);
        memcpy(local_2038,in_RDI->linebuf_ + local_e844,__n << 2);
        memcpy(local_e038,in_RDI->colorbuf_ + local_e844,__n * 0x18);
        memcpy(local_e838,in_RDI->flagbuf_ + local_e844,__n);
        if (local_30 != 0) {
          in_RDI->linebuf_[local_34] = L'-';
          local_34 = local_34 + 1;
        }
        while( true ) {
          padding = in_stack_ffffffffffff178c & 0xffffff;
          if (0 < local_34) {
            padding = CONCAT13(in_RDI->linebuf_[local_34 + -1] == L' ',
                               (int3)in_stack_ffffffffffff178c);
          }
          if (((char)(padding >> 0x18) == '\0') || ((in_RDI->flagbuf_[local_34 + -1] & 1) != 0))
          break;
          in_stack_ffffffffffff178c = padding;
          local_34 = local_34 + -1;
        }
        in_RDI->linebuf_[local_34] = L'\0';
        flush_line((CVmFormatter *)CONCAT44(iVar4,in_stack_ffffffffffff1790),padding);
        memcpy(in_RDI->linebuf_,local_2038,__n << 2);
        memcpy(in_RDI->colorbuf_,local_e038,__n * 0x18);
        memcpy(in_RDI->flagbuf_,local_e838,__n);
        in_RDI->linepos_ = (int)__n;
        in_RDI->linecol_ = (int)__n;
      }
    }
    else {
      flush_line((CVmFormatter *)CONCAT44(iVar4,in_stack_ffffffffffff1790),in_stack_ffffffffffff178c
                );
      in_RDI->linepos_ = 0;
      in_RDI->linecol_ = 0;
      in_RDI->linebuf_[0] = L'\0';
      in_RDI->is_continuation_ = 0;
    }
    buffer_rendered(in_RDI,local_c,local_11,local_10);
  }
  return;
}

Assistant:

void CVmFormatter::buffer_expchar(VMG_ wchar_t c)
{
    /* presume the character takes up only one column */
    int cwid = 1;

    /* presume we'll use the current flags for the new character */
    unsigned char cflags = cur_flags_;

    /* assume it's not a quoted space */
    int qspace = FALSE;

    /* 
     *   Check for some special characters.
     *   
     *   If we have an underlying HTML renderer, keep track of the HTML
     *   lexical state, so we know if we're in a tag or in ordinary text.  We
     *   can pass through all of the special line-breaking and spacing
     *   characters to the underlying HTML renderer.
     *   
     *   If our underlying renderer is a plain text renderer, we actually
     *   parse the HTML ourselves, so HTML tags will never make it this far -
     *   the caller will already have interpreted any HTML tags and removed
     *   them from the text stream, passing only the final plain text to us.
     *   However, with a plain text renderer, we have to do all of the work
     *   of line breaking, so we must look at the special spacing and
     *   line-break control characters.  
     */
    if (html_target_)
    {
        /* 
         *   track the lexical state of the HTML stream going to the
         *   underlying renderer 
         */
        switch (html_passthru_state_)
        {
        case VMCON_HPS_MARKUP_END:
        case VMCON_HPS_NORMAL:
            /* check to see if we're starting a markup */
            if (c == '&')
                html_passthru_state_ = VMCON_HPS_ENTITY_1ST;
            else if (c == '<')
            {
                html_passthru_tagp_ = html_passthru_tag_;
                html_passthru_state_ = VMCON_HPS_TAG_START;
            }
            else
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_1ST:
            /* check to see what kind of entity we have */
            if (c == '#')
                html_passthru_state_ = VMCON_HPS_ENTITY_NUM_1ST;
            else if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
                html_passthru_state_ = VMCON_HPS_ENTITY_NAME;
            else
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_NUM_1ST:
            /* check to see what kind of number we have */
            if (c == 'x' || c == 'X')
                html_passthru_state_ = VMCON_HPS_ENTITY_HEX;
            else if (c >= '0' && c <= '9')
                html_passthru_state_ = VMCON_HPS_ENTITY_DEC;
            else
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_HEX:
            /* see if we're done with hex digits */
            if (c == ';')
                html_passthru_state_ = VMCON_HPS_MARKUP_END;
            else if ((c < '0' || c > '9')
                     && (c < 'a' || c > 'f')
                     && (c < 'A' || c > 'F'))
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_DEC:
            /* see if we're done with decimal digits */
            if (c == ';')
                html_passthru_state_ = VMCON_HPS_MARKUP_END;
            else if (c < '0' || c > '9')
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_ENTITY_NAME:
            /* see if we're done with alphanumerics */
            if (c == ';')
                html_passthru_state_ = VMCON_HPS_MARKUP_END;
            else if ((c < 'a' || c > 'z')
                     && (c < 'A' || c > 'Z')
                     && (c < '0' || c > '9'))
                html_passthru_state_ = VMCON_HPS_NORMAL;
            break;

        case VMCON_HPS_TAG_START:
            /* start of a tag, before the name - check for the name start */
            if (c == '/' && html_passthru_tagp_ == html_passthru_tag_)
            {
                /* 
                 *   note the initial '/', but stay in TAG_START state, so
                 *   that we skip any spaces between the '/' and the tag name
                 */
                *html_passthru_tagp_++ = '/';
            }
            else if ((c >= 'a' && c <= 'z')
                     || (c >= 'A' && c <= 'Z'))
            {
                /* start of the tag name */
                html_passthru_state_ = VMCON_HPS_TAG_NAME;
                *html_passthru_tagp_++ = (char)c;
            }
            else if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
            {
                /* 
                 *   ignore whitespace between '<' and the tag name - simply
                 *   stay in TAG_START mode 
                 */
            }
            else
            {
                /* anything else is invalid - must not be a tag after all */
                html_passthru_state_ = VMCON_HPS_NORMAL;
            }
            break;

        case VMCON_HPS_TAG_NAME:
            /* tag name - check for continuation */
            if ((c >= 'a' && c <= 'z')
                || (c >= 'A' && c <= 'Z'))
            {
                /* gather the tag name if it fits */
                if (html_passthru_tagp_ - html_passthru_tag_ + 1
					< (ptrdiff_t)sizeof(html_passthru_tag_))
                    *html_passthru_tagp_++ = (char)c;
            }
            else
            {
                /* end of the tag name */
                *html_passthru_tagp_ = '\0';
                html_passthru_state_ = VMCON_HPS_TAG;
                goto do_tag;
            }
            break;

        case VMCON_HPS_TAG:
            do_tag:
            /* see if we're done with the tag, or entering quoted material */
            if (c == '>')
            {
                /* switch to end of markup mode */
                html_passthru_state_ = VMCON_HPS_MARKUP_END;

                /* note if entering or exiting a PRE tag */
                if (stricmp(html_passthru_tag_, "pre") == 0)
                    ++html_pre_level_;
                else if (stricmp(html_passthru_tag_, "/pre") == 0
                         && html_pre_level_ != 0)
                    --html_pre_level_;
            }
            else if (c == '/'
                     && html_passthru_tagp_ != html_passthru_tag_
                     && *(html_passthru_tagp_ - 1) != '/')
            {
                /* add the '/' to the end of the tag name */
                if (html_passthru_tagp_ - html_passthru_tag_ + 1
					< (ptrdiff_t)sizeof(html_passthru_tag_))
                {
                    *html_passthru_tagp_++ = (char)c;
                    *html_passthru_tagp_ = '\0';
                }
            }
            else if (c == '"')
                html_passthru_state_ = VMCON_HPS_DQUOTE;
            else if (c == '\'')
                html_passthru_state_ = VMCON_HPS_SQUOTE;
            break;

        case VMCON_HPS_SQUOTE:
            /* see if we're done with the quoted material */
            if (c == '\'')
                html_passthru_state_ = VMCON_HPS_TAG;
            break;

        case VMCON_HPS_DQUOTE:
            /* see if we're done with the quoted material */
            if (c == '"')
                html_passthru_state_ = VMCON_HPS_TAG;
            break;

        default:
            /* ignore other states */
            break;
        }
    }
    else
    {
        /* check for special characters */
        switch(c)
        {
        case 0x00AD:
            /*
             *   The Unicode "soft hyphen" character.  This indicates a
             *   point at which we can insert a hyphen followed by a soft
             *   line break, if it's a convenient point to break the line;
             *   if we don't choose to break the line here, the soft hyphen
             *   is invisible.  
             *   
             *   Don't buffer anything at all; instead, just flag the
             *   preceding character as being a soft hyphenation point, so
             *   that we can insert a hyphen there when we get around to
             *   breaking the line.  
             */
            if (linepos_ != 0)
                flagbuf_[linepos_ - 1] |= VMCON_OBF_SHY;

            /* we don't need to buffer anything, so we're done */
            return;

        case 0xFEFF:
            /*
             *   The Unicode zero-width non-breaking space.  This indicates
             *   a point at which we cannot break the line, even if we could
             *   normally break here.  Flag the preceding character as a
             *   non-breaking point.  Don't buffer anything for this
             *   character, as it's not rendered; it merely controls line
             *   breaking.  
             */
            if (linepos_ != 0)
                flagbuf_[linepos_ - 1] |= VMCON_OBF_NOBREAK;

            /* we don't buffer anything, so we're done */
            return;

        case 0x200B:                                    /* zero-width space */
        case 0x200a:                                          /* hair space */
        case 0x2008:                                   /* punctuation space */
            /* 
             *   Zero-width space: This indicates an explicitly allowed
             *   line-breaking point, but is rendered as invisible.  Flag the
             *   preceding character as an OK-to-break point, but don't
             *   buffer anything, as the zero-width space isn't rendered.  
             *   
             *   Hair and punctuation spaces: Treat these very thin spaces as
             *   invisible in a fixed-width font.  These are normally used
             *   for subtle typographical effects in proportionally-spaced
             *   fonts; for example, for separating a right single quote from
             *   an immediately following right double quote (as in a
             *   quotation within a quotation: I said, "type 'quote'").  When
             *   translating to fixed-pitch type, these special spacing
             *   effects aren't usually necessary or desirable because of the
             *   built-in space in every character cell.
             *   
             *   These spaces cancel any explicit non-breaking flag that
             *   precedes them, since they cause the flag to act on the
             *   space's left edge, while leaving the right edge open for
             *   breaking.  Since we don't actually take up any buffer space,
             *   push our right edge's breakability back to the preceding
             *   character.  
             */
            if (linepos_ != 0)
            {
                flagbuf_[linepos_ - 1] &= ~VMCON_OBF_NOBREAK;
                flagbuf_[linepos_ - 1] |= VMCON_OBF_OKBREAK;
            }

            /* we don't buffer anything, so we're done */
            return;

        case 0x00A0:
            /* non-breaking space - buffer it as given */
            break;
            
        case 0x0015:             /* special internal quoted space character */
        case 0x2005:                                   /* four-per-em space */
        case 0x2006:                                    /* six-per-em space */
        case 0x2007:                                        /* figure space */
        case 0x2009:                                          /* thin space */
            /* 
             *   Treat all of these as non-combining spaces, and render them
             *   all as single ordinary spaces.  In text mode, we are
             *   limited to a monospaced font, so we can't render any
             *   differences among these various thinner-than-normal spaces.
             */
            qspace = TRUE;
            c = ' ';
            break;

        case 0x2002:                                            /* en space */
        case 0x2004:                                  /* three-per-em space */
            /* 
             *   En space, three-per-em space - mark these as non-combining,
             *   and render them as a two ordinary spaces.  In the case of
             *   an en space, we really do want to take up the space of two
             *   ordinary spaces; for a three-per-em space, we want about a
             *   space and a half, but since we're dealing with a monospaced
             *   font, we have to round up to a full two spaces.  
             */
            qspace = TRUE;
            cwid = 2;
            c = ' ';
            break;
            
        case 0x2003:
            /* em space - mark it as non-combining */
            qspace = TRUE;
            
            /* render this as three ordinary spaces */
            cwid = 3;
            c = ' ';
            break;

        default:
            /* 
             *   Translate any horizontal whitespace character to a regular
             *   space character.  Note that, once this is done, we don't
             *   need to worry about calling t3_is_space() any more - we can
             *   just check that we have a regular ' ' character.  
             */
            if (t3_is_space(c))
            {
                /* convert it to an ordinary space */
                c = ' ';
                
                /* if we're in obey-whitespace mode, quote the space */
                qspace = obey_whitespace_ || html_pre_level_ > 0;
            }
            break;
        }
    }

    /* if it's a quoted space, mark it as such in the buffer flags */
    if (qspace)
        cflags |= VMCON_OBF_QSPACE;

    /* 
     *   Check for the caps/nocaps flags - but only if our HTML lexical state
     *   in the underlying text stream is plain text, because we don't want
     *   to apply these flags to alphabetic characters that are inside tag or
     *   entity text.  
     */
    if (html_passthru_state_ == VMCON_HPS_NORMAL)
    {
        if ((capsflag_ || allcapsflag_) && t3_is_alpha(c))
        {
            /* 
             *   capsflag or allcapsflag is set, so render this character in
             *   title case or upper case, respectively.  For the ordinary
             *   capsflag, use title case rather than upper case, since
             *   capsflag conceptually only applies to a single letter, and
             *   some Unicode characters represent ligatures of multiple
             *   letters.  In such cases we only want to capitalize the first
             *   letter in the ligature, which is exactly what we get when we
             *   convert it to the title case.
             *   
             *   Start by consuming the capsflag. 
             */
            capsflag_ = FALSE;

            /* get the appropriate expansion */
            const wchar_t *u = allcapsflag_ ? t3_to_upper(c) : t3_to_title(c);

            /*
             *   If there's no expansion, continue with the original
             *   character.  If it's a single-character expansion, continue
             *   with the replacement character.  If it's a 1:N expansion,
             *   recursively buffer the expansion. 
             */
            if (u != 0 && u[0] != 0)
            {
                if (u[1] != 0)
                {
                    /* 1:N expansion - handle it recursively */
                    buffer_wstring(vmg_ u);
                    return;
                }
                else
                {
                    /* 1:1 expansion - continue with the new character */
                    c = u[0];
                }
            }
        }
        else if (nocapsflag_ && t3_is_alpha(c))
        {
            /* lower-casing the character - consume the flag */
            nocapsflag_ = FALSE;

            /* get the expansion */
            const wchar_t *l = t3_to_lower(c);

            /* 
             *   recursively handle 1:N expansions; otherwise continue with
             *   the replacement character, if there is one 
             */
            if (l != 0 && l[0] != 0)
            {
                if (l[1] != 0)
                {
                    /* 1:N expansion - handle it recursively */
                    buffer_wstring(vmg_ l);
                    return;
                }
                else
                {
                    /* 1:1 expansion - continue with the new character */
                    c = l[0];
                }
            }
        }
    }

    /*
     *   If this is a space of some kind, we might be able to consolidate it
     *   with a preceding character.  If the display layer is an HTML
     *   renderer, pass spaces through intact, and let the HTML parser handle
     *   whitespace compression.
     */
    if (c == ' ' && html_pre_level_ == 0)
    {
        /* ignore ordinary whitespace at the start of a line */
        if (linecol_ == 0 && !qspace)
            return;

        /* 
         *   Consolidate runs of whitespace.  Ordinary whitespace is
         *   subsumed into any type of quoted spaces, but quoted spaces do
         *   not combine.  
         */
        if (linepos_ > 0)
        {
            wchar_t prv;

            /* get the previous character */
            prv = linebuf_[linepos_ - 1];
            
            /* 
             *   if the new character is an ordinary (combining) whitespace
             *   character, subsume it into any preceding space character 
             */
            if (!qspace && prv == ' ')
                return;

            /* 
             *   if the new character is a quoted space, and the preceding
             *   character is a non-quoted space, subsume the preceding
             *   space into the new character 
             */
            if (qspace
                && prv == ' '
                && !(flagbuf_[linepos_ - 1] & VMCON_OBF_QSPACE))
            {
                /* remove the preceding ordinary whitespace */
                --linepos_;
                --linecol_;
            }
        }
    }

    /* if the new character fits in the line, add it */
    if (linecol_ + cwid < get_buffer_maxcol())
    {
        /* buffer this character */
        buffer_rendered(c, cflags, cwid);

        /* we're finished processing the character */
        return;
    }

    /*
     *   The line would overflow if this character were added.
     *   
     *   If we're trying to output any kind of breakable space, just add it
     *   to the line buffer for now; we'll come back later and figure out
     *   where to break upon buffering the next non-space character.  This
     *   ensures that we don't carry trailing space (even trailing en or em
     *   spaces) to the start of the next line if we have an explicit
     *   newline before the next non-space character.  
     */
    if (c == ' ')
    {
        /* 
         *   We're adding a space, so we'll figure out the breaking later,
         *   when we output the next non-space character.  If the preceding
         *   character is any kind of space, don't bother adding the new
         *   one, since any contiguous whitespace at the end of the line has
         *   no effect on the line's appearance.  
         */
        if (linebuf_[linepos_ - 1] == ' ')
        {
            /* 
             *   We're adding a space to a line that already ends in a
             *   space, so we don't really need to add the character.
             *   However, reflect the virtual addition in the output column
             *   position, since the space does affect our column position.
             *   We know that we're adding the new space even though we have
             *   a space preceding, since we wouldn't have gotten this far
             *   if we were going to collapse the space with a run of
             *   whitespace. 
             */
        }
        else
        {
            /* the line doesn't already end in space, so add the space */
            linebuf_[linepos_] = ' ';
            flagbuf_[linepos_] = cflags;
            colorbuf_[linepos_] = cur_color_;

            /* advance one character in the buffer */
            ++linepos_;
        }

        /* 
         *   Adjust the column position for the added space.  Note that we
         *   adjust by the rendered width of the new character even though
         *   we actually added only one character; we only add one character
         *   to the buffer to avoid buffer overflow, but the column position
         *   needs adjustment by the full rendered width.  The fact that the
         *   actual buffer size and rendered width no longer match isn't
         *   important because the difference is entirely in invisible
         *   whitespace at the right end of the line.  
         */
        linecol_ += cwid;

        /* done for now */
        return;
    }
    
    /*
     *   We're adding something other than an ordinary space to the line,
     *   and the new character won't fit, so we must find an appropriate
     *   point to break the line. 
     *   
     *   First, add the new character to the buffer - it could be
     *   significant in how we calculate the break position.  (Note that we
     *   allocate the buffer with space for one extra character after
     *   reaching the maximum line width, so we know we have room for this.)
     */
    linebuf_[linepos_] = c;
    flagbuf_[linepos_] = cur_flags_;

    /* 
     *   if the underlying OS layer is doing the line wrapping, just flush
     *   out the buffer; don't bother trying to do any line wrapping
     *   ourselves, since this work would just be redundant with what the OS
     *   layer has to do anyway 
     */
    if (os_line_wrap_)
    {
        /* flush the line, adding no padding after it */
        flush_line(vmg_ FALSE);

        /* 
         *   we've completely cleared out the line buffer, so reset all of
         *   the line buffer counters 
         */
        linepos_ = 0;
        linecol_ = 0;
        linebuf_[0] = '\0';
        is_continuation_ = FALSE;

        /* we're done */
        goto done_with_wrapping;
    }

    /*
     *   Scan backwards, looking for a break position.  Start at the current
     *   column: we know we can fit everything up to this point on a line on
     *   the underlying display, so this is the rightmost possible position
     *   at which we could break the line.  Keep going until we find a
     *   breaking point or reach the left edge of the line.  
     */
    int shy, i;
    for (i = linepos_, shy = FALSE ; i >= 0 ; --i)
    {
        unsigned char f;
        unsigned char prvf;
        
        /* 
         *   There are two break modes: word-break mode and break-anywhere
         *   mode.  The modes are applied to each character, via the buffer
         *   flags.
         *   
         *   In word-break mode, we can break at any ordinary space, at a
         *   soft hyphen, just after a regular hyphen, or at any explicit
         *   ok-to-break point; but we can't break after any character
         *   marked as a no-break point.
         *   
         *   In break-anywhere mode, we can break between any two
         *   characters, except that we can't break after any character
         *   marked as a no-break point.  
         */

        /* get the current character's flags */
        f = flagbuf_[i];

        /* get the preceding character's flags */
        prvf = (i > 0 ? flagbuf_[i-1] : 0);

        /* 
         *   if the preceding character is marked as a no-break point, we
         *   definitely can't break here, so keep looking 
         */
        if ((prvf & VMCON_OBF_NOBREAK) != 0)
            continue;

        /* 
         *   if the preceding character is marked as an explicit ok-to-break
         *   point, we definitely can break here 
         */
        if ((prvf & VMCON_OBF_OKBREAK) != 0)
            break;

        /* 
         *   If the current character is in a run of break-anywhere text,
         *   then we can insert a break just before the current character.
         *   Likewise, if the preceding character is in a run of
         *   break-anywhere text, we can break just after the preceding
         *   character, which is the same as breaking just before the
         *   current character.
         *   
         *   Note that we must test for both cases to properly handle
         *   boundaries between break-anywhere and word-break text.  If
         *   we're switching from word-break to break-anywhere text, the
         *   current character will be marked as break-anywhere, so if we
         *   only tested the previous character, we'd miss this transition.
         *   If we're switching from break-anywhere to word-break text, the
         *   previous character will be marked as break-anywhere, so we'd
         *   miss the fact that we could break right here (rather than
         *   before the previous character) if we didn't test it explicitly.
         */
        if ((f & VMCON_OBF_BREAK_ANY) != 0
            || (i > 0 && (prvf & VMCON_OBF_BREAK_ANY) != 0))
            break;

        /* 
         *   If the preceding character is marked as a soft hyphenation
         *   point, and we're not at the rightmost position, we can break
         *   here with hyphenation.  We can't break with hyphenation at the
         *   last position because hyphenation requires us to actually
         *   insert a hyphen character, and we know that at the last
         *   position we don't have room for inserting another character.  
         */
        if (i > 0 && i < linepos_ && (prvf & VMCON_OBF_SHY) != 0)
        {
            /* note that we're breaking at a soft hyphen */
            shy = TRUE;

            /* we can break here */
            break;
        }

        /* 
         *   we can break to the left of a space (i.e., we can break before
         *   the current character if the current character is a space) 
         */
        if (linebuf_[i] == ' ')
            break;

        /* 
         *   We can also break to the right of a space.  We need to check
         *   for this case separately from checking that the current
         *   charatcer is a space (which breaks to the left of the space),
         *   because we could have a no-break marker on one side of the
         *   space but not on the other side.  
         */
        if (i > 0 && linebuf_[i-1] == ' ')
            break;

        /* 
         *   If we're to the right of a hyphen, we can break here.  However,
         *   don't break in the middle of a set of consecutive hyphens
         *   (i.e., we don't want to break up "--" sequences).
         */
        if (i > 0 && linebuf_[i-1] == '-' && linebuf_[i] != '-')
            break;
    }
    
    /* check to see if we found a good place to break */
    if (i < 0)
    {
        /*
         *   We didn't find a good place to break.  If the underlying
         *   console allows overrunning the line width, simply add the
         *   character, even though it overflows; otherwise, force a break
         *   at the line width, even though it doesn't occur at a natural
         *   breaking point.
         *   
         *   In any case, don't let our buffer fill up beyond its maximum
         *   size.  
         */
        if (!console_->allow_overrun() || linepos_ + 1 >= OS_MAXWIDTH)
        {
            /* 
             *   we didn't find any good place to break, and the console
             *   doesn't allow us to overrun the terminal width - flush the
             *   entire line as-is, breaking arbitrarily in the middle of a
             *   word 
             */
            flush_line(vmg_ FALSE);
            
            /* 
             *   we've completely cleared out the line buffer, so reset all
             *   of the line buffer counters 
             */
            linepos_ = 0;
            linecol_ = 0;
            linebuf_[0] = '\0';
            is_continuation_ = FALSE;
        }
    }
    else
    {
        wchar_t tmpbuf[OS_MAXWIDTH];
        vmcon_color_t tmpcolor[OS_MAXWIDTH];
        unsigned char tmpflags[OS_MAXWIDTH];
        size_t tmpchars;
        int nxti;

        /* null-terminate the line buffer */        
        linebuf_[linepos_] = '\0';

        /* trim off leading spaces on the next line after the break */
        for (nxti = i ; linebuf_[nxti] == ' ' ; ++nxti) ;

        /* 
         *   The next line starts after the break - save a copy.  We actually
         *   have to save a copy of the trailing material outside the buffer,
         *   since we might have to overwrite the trailing part of the buffer
         *   to expand tabs.  
         */
        tmpchars = wcslen(&linebuf_[nxti]);
        memcpy(tmpbuf, &linebuf_[nxti], tmpchars*sizeof(tmpbuf[0]));
        memcpy(tmpcolor, &colorbuf_[nxti], tmpchars*sizeof(tmpcolor[0]));
        memcpy(tmpflags, &flagbuf_[nxti], tmpchars*sizeof(tmpflags[0]));

        /* if we're breaking at a soft hyphen, insert a real hyphen */
        if (shy)
            linebuf_[i++] = '-';
        
        /* trim off trailing spaces */
        for ( ; i > 0 && linebuf_[i-1] == ' ' ; --i)
        {
            /* stop if we've reached a non-breaking point */
            if ((flagbuf_[i-1] & VMCON_OBF_NOBREAK) != 0)
                break;
        }

        /* terminate the buffer after the break point */
        linebuf_[i] = '\0';
        
        /* write out everything up to the break point */
        flush_line(vmg_ TRUE);

        /* move the saved start of the next line into the line buffer */
        memcpy(linebuf_, tmpbuf, tmpchars*sizeof(tmpbuf[0]));
        memcpy(colorbuf_, tmpcolor, tmpchars*sizeof(tmpcolor[0]));
        memcpy(flagbuf_, tmpflags, tmpchars*sizeof(tmpflags[0]));
        linecol_ = linepos_ = tmpchars;
    }
    
done_with_wrapping:
    /* add the new character to buffer */
    buffer_rendered(c, cflags, cwid);
}